

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_setfenv(lua_State *L,int idx)

{
  int iVar1;
  GCObject *pGVar2;
  TValue *pTVar3;
  int in_ESI;
  lua_State *in_RDI;
  TValue *i_o;
  int res;
  StkId o;
  undefined4 in_stack_ffffffffffffffd0;
  GCObject *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  
  iVar4 = 1;
  pTVar3 = index2adr(in_RDI,in_ESI);
  iVar1 = pTVar3->tt;
  if (iVar1 == 6) {
    (((pTVar3->value).gc)->h).array = (TValue *)in_RDI->top[-1].value;
  }
  else if (iVar1 == 7) {
    (((pTVar3->value).gc)->h).array = (TValue *)in_RDI->top[-1].value;
  }
  else if (iVar1 == 8) {
    pGVar2 = (pTVar3->value).gc;
    in_stack_ffffffffffffffd8 = (GCObject *)&(pGVar2->th).l_gt;
    *(Value *)&(in_stack_ffffffffffffffd8->gch).next = in_RDI->top[-1].value;
    (pGVar2->th).l_gt.tt = 5;
  }
  else {
    iVar4 = 0;
  }
  if (((iVar4 != 0) && ((((in_RDI->top[-1].value.gc)->gch).marked & 3) != 0)) &&
     (((((pTVar3->value).gc)->gch).marked & 4) != 0)) {
    luaC_barrierf((lua_State *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
                  (GCObject *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  }
  in_RDI->top = in_RDI->top + -1;
  return iVar4;
}

Assistant:

static int lua_setfenv(lua_State*L,int idx){
StkId o;
int res=1;
api_checknelems(L,1);
o=index2adr(L,idx);
api_checkvalidindex(L,o);
luai_apicheck(L,ttistable(L->top-1));
switch(ttype(o)){
case 6:
clvalue(o)->c.env=hvalue(L->top-1);
break;
case 7:
uvalue(o)->env=hvalue(L->top-1);
break;
case 8:
sethvalue(L,gt(thvalue(o)),hvalue(L->top-1));
break;
default:
res=0;
break;
}
if(res)luaC_objbarrier(L,gcvalue(o),hvalue(L->top-1));
L->top--;
return res;
}